

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.h
# Opt level: O0

void __thiscall iqnet::Inet_addr::Inet_addr(Inet_addr *this,Inet_addr *param_1)

{
  Inet_addr *param_1_local;
  Inet_addr *this_local;
  
  this->_vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_002518e8;
  boost::shared_ptr<iqnet::Inet_addr::Impl>::shared_ptr(&this->impl_,&param_1->impl_);
  return;
}

Assistant:

class LIBIQXMLRPC_API Inet_addr {
  struct Impl;
  boost::shared_ptr<Impl> impl_;

public:
  //! Does nothing.
  Inet_addr() {}

  Inet_addr( const struct sockaddr_in& );
  Inet_addr( const std::string& host, int port = 0 );
  Inet_addr( int port );

  virtual ~Inet_addr() {}

  const struct sockaddr_in* get_sockaddr() const;
  const std::string& get_host_name() const;
  int get_port() const;
}